

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O1

Trampoline * __thiscall
LambdaMeaning::Eval(Trampoline *__return_storage_ptr__,LambdaMeaning *this,Sexp *act)

{
  Sexp *pSVar1;
  ContractFrameProtector local_38;
  ContractFrameProtector __contract_frame;
  Sexp *act_local;
  FrameProtector __frame_prot;
  
  __contract_frame.protected_frame = (ContractFrame *)act;
  ContractFrameProtector::ContractFrameProtector(&local_38,"Eval");
  ContractFrame::CheckPrecondition
            (local_38.protected_frame,(__contract_frame.protected_frame)->restrictions == 7,
             "act->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&act_local,"Eval");
  FrameProtector::ProtectValue((FrameProtector *)&act_local,(Sexp **)&__contract_frame,"act");
  pSVar1 = GcHeap::AllocateFunction(this,(Sexp *)__contract_frame.protected_frame);
  __return_storage_ptr__->kind = Value;
  (__return_storage_ptr__->field_1).value = pSVar1;
  FrameProtector::~FrameProtector((FrameProtector *)&act_local);
  ContractFrameProtector::~ContractFrameProtector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Trampoline LambdaMeaning::Eval(Sexp *act) {
  CONTRACT { PRECONDITION(act->IsActivation()); }